

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void discordpp::from_json(json *j,MessageCreateEvent *t)

{
  bool bVar1;
  const_reference pvVar2;
  MessageCreateEvent *t_local;
  json *j_local;
  
  from_json(j,&t->super_Message);
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[9],_0>(j,(char (*) [9])0x33ed42);
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[9],_0>(j,(char (*) [9])0x33ed42);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_to<discordpp::omittable_field<discordpp::Snowflake>,_0>(pvVar2,&t->guild_id);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[7],_0>(j,(char (*) [7])"member");
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[7],_0>(j,(char (*) [7])"member");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_to<discordpp::omittable_field<discordpp::GuildMember>,_0>(pvVar2,&t->member);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[9],_0>(j,(char (*) [9])0x33b620);
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[9],_0>(j,(char (*) [9])0x33b620);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_to<discordpp::field<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_>,_0>
              (pvVar2,&(t->super_Message).mentions);
  }
  return;
}

Assistant:

void from_json(const nlohmann::json &j, MessageCreateEvent &t) {
        from_json(j, (Message&)t);
        if(j.contains("guild_id")){j.at("guild_id").get_to(t.guild_id);}
        if(j.contains("member")){j.at("member").get_to(t.member);}
        if(j.contains("mentions")){j.at("mentions").get_to(t.mentions);}
    }